

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

GenerateBlockArraySymbol *
slang::ast::GenerateBlockArraySymbol::fromSyntax
          (Compilation *comp,LoopGenerateSyntax *syntax,SymbolIndex scopeIndex,ASTContext *context,
          uint32_t constructIndex)

{
  Scope *scope;
  Type *this;
  Type *lhs;
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined4 uVar3;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  undefined1 auVar4 [16];
  pointer ppGVar5;
  __index_type _Var6;
  value_type_pointer pSVar7;
  bool bVar8;
  int iVar9;
  Scope *cur;
  GenerateBlockArraySymbol *this_00;
  Scope *pSVar10;
  Symbol *pSVar11;
  Expression *expr;
  StatementBlockSymbol *pSVar12;
  VariableSymbol *symbol;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__v;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar13;
  Diagnostic *pDVar14;
  size_t sVar15;
  undefined4 extraout_var_01;
  uint uVar16;
  ulong uVar17;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_02;
  SourceLocation this_01;
  DiagCode code;
  ulong uVar18;
  ulong uVar19;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *member;
  group_type_pointer pgVar20;
  ulong hash;
  ulong uVar21;
  ulong pos0;
  long lVar22;
  long lVar23;
  ulong uVar24;
  SVInt *rhs;
  LoopGenerateSyntax *pLVar25;
  SVIntStorage *other;
  undefined1 auVar26 [16];
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  SourceRange SVar43;
  string_view sVar44;
  SourceRange assignmentRange;
  LookupLocation location;
  Token genvar;
  ConstantValue stop;
  IdentifierNameSyntax *genvarSyntax;
  anon_class_48_6_985204b5 createBlock;
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> entries;
  ConstantValue initialVal;
  locator res;
  SmallSet<slang::SVInt,_8UL,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
  usedValues;
  SmallVector<slang::SVInt,_8UL> indices;
  EvalContext evalContext;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff868;
  SVInt *local_780;
  Token local_778;
  LoopGenerateSyntax *local_760;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *local_758;
  SourceLocation local_750;
  Compilation *local_748;
  Expression *local_740;
  Expression *local_738;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_730;
  char local_710;
  ulong local_708;
  ulong local_700;
  IdentifierNameSyntax *local_6f8;
  long local_6f0;
  group_type_pointer local_6e8;
  ulong local_6e0;
  ulong local_6d8;
  ulong local_6d0;
  ulong local_6c8;
  uint32_t local_6bc;
  uchar local_6b8;
  uchar uStack_6b7;
  uchar uStack_6b6;
  uchar uStack_6b5;
  uchar uStack_6b4;
  uchar uStack_6b3;
  uchar uStack_6b2;
  uchar uStack_6b1;
  uchar uStack_6b0;
  uchar uStack_6af;
  uchar uStack_6ae;
  uchar uStack_6ad;
  uchar uStack_6ac;
  uchar uStack_6ab;
  uchar uStack_6aa;
  uchar uStack_6a9;
  SourceRange local_6a8;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_698;
  undefined1 local_678;
  anon_class_48_6_985204b5 local_670;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_640;
  undefined1 local_628 [17];
  undefined1 uStack_617;
  undefined1 uStack_616;
  undefined1 uStack_615;
  undefined1 uStack_614;
  undefined1 uStack_613;
  undefined1 uStack_612;
  undefined1 uStack_611;
  undefined1 uStack_610;
  undefined1 uStack_60f;
  undefined1 uStack_60e;
  undefined1 uStack_60d;
  undefined1 uStack_60c;
  undefined1 uStack_60b;
  undefined1 uStack_60a;
  undefined1 uStack_609;
  undefined1 local_608 [16];
  AssertionInstanceDetails *local_5f8;
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> local_5f0;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_5b0;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_588;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_560;
  SourceLocation local_538 [16];
  Storage *local_4b8;
  undefined1 local_4b0 [32];
  value_type_pointer pSStack_490;
  ulong local_488;
  ulong local_480;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_470;
  SmallVectorBase<slang::SVInt> local_448 [3];
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_3b0;
  undefined1 local_388 [8];
  char *pcStack_380;
  undefined1 local_378;
  undefined1 uStack_377;
  undefined1 uStack_376;
  undefined1 uStack_375;
  undefined1 uStack_374;
  undefined1 uStack_373;
  undefined1 uStack_372;
  undefined1 uStack_371;
  undefined1 uStack_370;
  undefined1 uStack_36f;
  undefined1 uStack_36e;
  undefined1 uStack_36d;
  undefined1 uStack_36c;
  undefined1 uStack_36b;
  undefined1 uStack_36a;
  undefined1 uStack_369;
  TempVarSymbol *local_368;
  RandomizeDetails *pRStack_360;
  AssertionInstanceDetails *local_358;
  bitmask<slang::ast::EvalFlags> local_350;
  undefined1 local_34c [16];
  undefined4 local_33c;
  SmallVectorBase<slang::ast::EvalContext::Frame> local_338;
  LValue **local_280;
  size_type local_278;
  size_type local_270;
  LValue *local_268 [5];
  SmallVectorBase<slang::Diagnostic> local_240;
  SmallVectorBase<slang::Diagnostic> local_148;
  SourceRange local_50;
  bool local_40;
  
  local_6bc = constructIndex;
  getGenerateBlockName(&local_640,&((syntax->block).ptr)->super_SyntaxNode);
  this_00 = BumpAllocator::
            emplace<slang::ast::GenerateBlockArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&>
                      (&comp->super_BumpAllocator,comp,&local_640.first,&local_640.second,&local_6bc
                      );
  (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this_00->super_Symbol,(context->scope).ptr,syntax_00);
  local_778.kind = (syntax->identifier).kind;
  local_778._2_1_ = (syntax->identifier).field_0x2;
  local_778.numFlags.raw = (syntax->identifier).numFlags;
  local_778.rawLen = (syntax->identifier).rawLen;
  local_778.info = (syntax->identifier).info;
  if ((local_778._0_8_ & 0x10000) != 0) {
    return this_00;
  }
  local_760 = syntax;
  local_6f8 = BumpAllocator::emplace<slang::syntax::IdentifierNameSyntax,slang::parsing::Token&>
                        (&comp->super_BumpAllocator,&local_778);
  scope = (context->scope).ptr;
  lVar22 = 0;
  pSVar10 = scope;
  do {
    pSVar11 = pSVar10->thisSym;
    if (pSVar11->kind == GenerateBlock) {
LAB_003ace68:
      pSVar10 = pSVar11->parentScope;
      bVar8 = false;
    }
    else {
      bVar8 = true;
      if (pSVar11->kind == GenerateBlockArray) {
        lVar22 = (lVar22 + (ulong)(lVar22 == 0)) * *(long *)(pSVar11 + 2);
        goto LAB_003ace68;
      }
    }
  } while ((pSVar10 != (Scope *)0x0) && (!bVar8));
  local_780 = (SVInt *)CONCAT44(local_780._4_4_,scopeIndex);
  local_6c8 = (ulong)(comp->options).maxGenerateSteps;
  local_750 = (SourceLocation)context;
  if ((local_760->genvar).info == (Info *)0x0) {
    local_748 = comp;
    sVar44 = parsing::Token::valueText(&local_778);
    uVar2 = context->scope;
    uVar3 = context->lookupIndex;
    location.index = uVar3;
    location.scope = (Scope *)uVar2;
    local_6a8 = parsing::Token::range(&local_778);
    location._12_4_ = 0;
    in_stack_fffffffffffff868.m_bits = (underlying_type)local_6a8.startLoc;
    pSVar11 = Lookup::unqualifiedAt
                        (scope,sVar44,location,local_6a8,(bitmask<slang::ast::LookupFlags>)0x0);
    comp = local_748;
    if (pSVar11 == (Symbol *)0x0) {
      return this_00;
    }
    if (pSVar11->kind != Genvar) {
      SVar43 = parsing::Token::range(&local_778);
      pDVar14 = ASTContext::addDiag((ASTContext *)local_750,(DiagCode)0x20000a,SVar43);
      sVar44 = parsing::Token::valueText(&local_778);
      Diagnostic::operator<<(pDVar14,sVar44);
      Diagnostic::addNote(pDVar14,(DiagCode)0x50001,pSVar11->location);
      return this_00;
    }
    Compilation::noteReference(local_748,pSVar11,false);
  }
  else {
    _local_388 = parsing::Token::valueText(&local_778);
    local_538[0] = parsing::Token::location(&local_778);
    pSVar11 = &BumpAllocator::
               emplace<slang::ast::GenvarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                         (&comp->super_BumpAllocator,
                          (basic_string_view<char,_std::char_traits<char>_> *)local_388,local_538)->
               super_Symbol;
    pSVar11->originatingSyntax = (SyntaxNode *)local_6f8;
    Scope::insertMember(&this_00->super_Scope,pSVar11,(this_00->super_Scope).lastMember,false,true);
  }
  local_5f0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_ =
       (pointer)local_5f0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.
                firstElement;
  local_5f0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len = 0;
  local_5f0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.cap = 5;
  local_670.blockLoc = local_640.second;
  local_670.entries = &local_5f0;
  local_670.genvar = &local_778;
  local_670.genvarSyntax = &local_6f8;
  local_670.syntax = local_760;
  this = comp->integerType;
  lhs = (Type *)(local_760->initialExpr).ptr;
  local_670.comp = comp;
  SVar43 = parsing::Token::range(&local_760->equals);
  this_01 = local_750;
  assignmentRange.endLoc = local_750;
  assignmentRange.startLoc = SVar43.endLoc;
  expr = Expression::bindRValue
                   ((Expression *)this,lhs,(ExpressionSyntax *)SVar43.startLoc,assignmentRange,
                    (ASTContext *)0x0,in_stack_fffffffffffff868);
  ASTContext::eval((ConstantValue *)&local_5b0,(ASTContext *)this_01,expr,
                   (bitmask<slang::ast::EvalFlags>)0x0);
  if (local_5b0._M_index != '\0') {
    auVar4._12_4_ = 0;
    auVar4._0_12_ = stack0xfffffffffffffc7c;
    _local_388 = (string_view)(auVar4 << 0x20);
    local_538[0] = (SourceLocation)((ulong)local_538[0] & 0xffffffff00000000);
    pSVar12 = BumpAllocator::
              emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation&,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                        (&comp->super_BumpAllocator,comp,(char (*) [1])0x46fee9,&local_640.second,
                         (StatementBlockKind *)local_388,(VariableLifetime *)local_538);
    _local_388 = parsing::Token::valueText(&local_778);
    local_538[0] = parsing::Token::location(&local_778);
    local_448[0].data_ = (pointer)((ulong)local_448[0].data_._4_4_ << 0x20);
    symbol = BumpAllocator::
             emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime>
                       (&comp->super_BumpAllocator,
                        (basic_string_view<char,_std::char_traits<char>_> *)local_388,local_538,
                        (VariableLifetime *)local_448);
    (symbol->super_ValueSymbol).declaredType.type = comp->integerType;
    *(byte *)&(symbol->flags).m_bits = (byte)(symbol->flags).m_bits | 2;
    (pSVar12->super_Symbol).parentScope = *(Scope **)this_01;
    (pSVar12->super_Symbol).indexInScope = scopeIndex;
    Scope::insertMember(&pSVar12->super_Scope,(Symbol *)symbol,(pSVar12->super_Scope).lastMember,
                        false,true);
    pLVar25 = local_760;
    local_628._8_4_ = 0xffffffff;
    stack0xfffffffffffff9e8 = (undefined1  [16])0x0;
    local_608 = (undefined1  [16])0x0;
    local_5f8 = (AssertionInstanceDetails *)0x0;
    local_628._0_8_ = &pSVar12->super_Scope;
    iVar9 = Expression::bind((int)(local_760->stopExpr).ptr,(sockaddr *)local_628,0);
    local_738 = (Expression *)CONCAT44(extraout_var,iVar9);
    iVar9 = Expression::bind((int)(pLVar25->iterationExpr).ptr,(sockaddr *)local_628,8);
    local_740 = (Expression *)CONCAT44(extraout_var_00,iVar9);
    bVar8 = Expression::bad(local_738);
    if (((!bVar8) && (bVar8 = Expression::bad(local_740), !bVar8)) &&
       (bVar8 = ASTContext::requireBooleanConvertible((ASTContext *)this_01,local_738), bVar8)) {
      local_338.data_ = (pointer)local_338.firstElement;
      local_358 = local_5f8;
      pcStack_380._4_4_ = local_628._12_4_;
      pcStack_380._0_4_ = local_628._8_4_;
      local_368 = (TempVarSymbol *)local_608._0_8_;
      pRStack_360 = (RandomizeDetails *)local_608._8_8_;
      local_378 = local_628[0x10];
      uStack_377 = uStack_617;
      uStack_376 = uStack_616;
      uStack_375 = uStack_615;
      uStack_374 = uStack_614;
      uStack_373 = uStack_613;
      uStack_372 = uStack_612;
      uStack_371 = uStack_611;
      uStack_370 = uStack_610;
      uStack_36f = uStack_60f;
      uStack_36e = uStack_60e;
      uStack_36d = uStack_60d;
      uStack_36c = uStack_60c;
      uStack_36b = uStack_60b;
      uStack_36a = uStack_60a;
      uStack_369 = uStack_609;
      local_388 = (undefined1  [8])local_628._0_8_;
      local_350.m_bits = '\0';
      local_34c = (undefined1  [16])0x0;
      local_33c = 0;
      local_338.len = 0;
      local_338.cap = 2;
      local_280 = local_268;
      local_278 = 0;
      local_270 = 5;
      local_240.data_ = (pointer)local_240.firstElement;
      local_240.len = 0;
      local_240.cap = 2;
      local_148.data_ = (pointer)local_148.firstElement;
      local_148.len = 0;
      local_148.cap = 2;
      local_40 = false;
      local_50.startLoc = (SourceLocation)0x0;
      local_50.endLoc = (SourceLocation)0x0;
      EvalContext::pushEmptyFrame((EvalContext *)local_388);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_560,
                        (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_5b0);
      __v = &EvalContext::createLocal
                       ((EvalContext *)local_388,&symbol->super_ValueSymbol,
                        (ConstantValue *)&local_560)->value;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_560);
      pvVar13 = std::
                get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          (__v);
      if ((pvVar13->super_SVIntStorage).unknownFlag == true) {
        SVar43 = parsing::Token::range(&local_778);
        pDVar14 = ASTContext::addDiag((ASTContext *)local_628,(DiagCode)0x3e0006,SVar43);
        Diagnostic::operator<<(pDVar14,(ConstantValue *)__v);
      }
      local_4b8 = (Storage *)local_538;
      local_4b0._8_8_ = 0x3f;
      local_4b0._16_8_ = 1;
      stack0xfffffffffffffb68 = ZEXT816(0x46c9a0);
      local_488 = 0;
      uVar24 = 0;
      local_480 = 0;
      local_448[0].data_ = (pointer)local_448[0].firstElement;
      local_448[0].len = 0;
      local_448[0].cap = 8;
      local_758 = __v;
      local_748 = comp;
      local_4b0._0_8_ = local_4b8;
      do {
        uVar24 = uVar24 + lVar22 + (ulong)(lVar22 == 0);
        if (local_6c8 < uVar24) {
          SVar43 = parsing::Token::range(&pLVar25->keyword);
          member = (_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)0x6c0006;
          ASTContext::addDiag((ASTContext *)this_01,(DiagCode)0x6c0006,SVar43);
          goto LAB_003ad90a;
        }
        Expression::eval((ConstantValue *)&local_730,local_738,(EvalContext *)local_388);
        if ((local_710 == '\0') ||
           (bVar8 = ConstantValue::isTrue((ConstantValue *)&local_730), !bVar8)) {
          this_00->valid = local_710 != '\0';
LAB_003ad4fd:
          bVar8 = false;
        }
        else {
          pvVar13 = std::
                    get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                              (__v);
          SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt&>(local_448,pvVar13);
          pvVar13 = std::
                    get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                              (__v);
          sVar15 = SVInt::hash(pvVar13);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = sVar15;
          hash = SUB168(auVar1 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar1 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar21 = hash >> (local_4b0[8] & 0x3f);
          lVar23 = (hash & 0xff) * 4;
          uVar27 = (&UNK_0046cabc)[lVar23];
          uVar28 = (&UNK_0046cabd)[lVar23];
          uVar29 = (&UNK_0046cabe)[lVar23];
          uVar30 = (&UNK_0046cabf)[lVar23];
          uVar17 = (ulong)((uint)hash & 7);
          uVar19 = 0;
          pos0 = uVar21;
          uVar31 = uVar27;
          uVar32 = uVar28;
          uVar33 = uVar29;
          uVar34 = uVar30;
          uVar35 = uVar27;
          uVar36 = uVar28;
          uVar37 = uVar29;
          uVar38 = uVar30;
          uVar39 = uVar27;
          uVar40 = uVar28;
          uVar41 = uVar29;
          uVar42 = uVar30;
          do {
            pgVar20 = (group_type_pointer)(local_4b0._24_8_ + uVar21 * 0x10);
            auVar26[0] = -(pgVar20->m[0].n == uVar27);
            auVar26[1] = -(pgVar20->m[1].n == uVar28);
            auVar26[2] = -(pgVar20->m[2].n == uVar29);
            auVar26[3] = -(pgVar20->m[3].n == uVar30);
            auVar26[4] = -(pgVar20->m[4].n == uVar31);
            auVar26[5] = -(pgVar20->m[5].n == uVar32);
            auVar26[6] = -(pgVar20->m[6].n == uVar33);
            auVar26[7] = -(pgVar20->m[7].n == uVar34);
            auVar26[8] = -(pgVar20->m[8].n == uVar35);
            auVar26[9] = -(pgVar20->m[9].n == uVar36);
            auVar26[10] = -(pgVar20->m[10].n == uVar37);
            auVar26[0xb] = -(pgVar20->m[0xb].n == uVar38);
            auVar26[0xc] = -(pgVar20->m[0xc].n == uVar39);
            auVar26[0xd] = -(pgVar20->m[0xd].n == uVar40);
            auVar26[0xe] = -(pgVar20->m[0xe].n == uVar41);
            auVar26[0xf] = -(pgVar20->m[0xf].n == uVar42);
            uVar16 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
            uVar18 = uVar19;
            pgVar20 = (group_type_pointer)local_4b0._24_8_;
            lVar23 = uVar21 * 0x10;
            if (uVar16 != 0) {
              local_6e8 = (group_type_pointer)local_4b0._24_8_;
              pSVar7 = pSStack_490;
              local_708 = pos0;
              local_700 = hash;
              local_6f0 = uVar21 * 0x10;
              local_6e0 = uVar19;
              local_6d8 = uVar21;
              local_6d0 = uVar17;
              local_6b8 = uVar27;
              uStack_6b7 = uVar28;
              uStack_6b6 = uVar29;
              uStack_6b5 = uVar30;
              uStack_6b4 = uVar31;
              uStack_6b3 = uVar32;
              uStack_6b2 = uVar33;
              uStack_6b1 = uVar34;
              uStack_6b0 = uVar35;
              uStack_6af = uVar36;
              uStack_6ae = uVar37;
              uStack_6ad = uVar38;
              uStack_6ac = uVar39;
              uStack_6ab = uVar40;
              uStack_6aa = uVar41;
              uStack_6a9 = uVar42;
              do {
                iVar9 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
                  }
                }
                rhs = (SVInt *)((long)&pSVar7[uVar21 * 0xf].super_SVIntStorage.field_0 +
                               (ulong)(uint)(iVar9 << 4));
                bVar8 = exactlyEqual(pvVar13,rhs);
                this_01 = local_750;
                hash = local_700;
                pos0 = local_708;
                pLVar25 = local_760;
                if (bVar8) goto LAB_003ad519;
                uVar16 = uVar16 - 1 & uVar16;
              } while (uVar16 != 0);
              uVar17 = local_6d0;
              uVar21 = local_6d8;
              uVar18 = local_6e0;
              pgVar20 = local_6e8;
              lVar23 = local_6f0;
              uVar27 = local_6b8;
              uVar28 = uStack_6b7;
              uVar29 = uStack_6b6;
              uVar30 = uStack_6b5;
              uVar31 = uStack_6b4;
              uVar32 = uStack_6b3;
              uVar33 = uStack_6b2;
              uVar34 = uStack_6b1;
              uVar35 = uStack_6b0;
              uVar36 = uStack_6af;
              uVar37 = uStack_6ae;
              uVar38 = uStack_6ad;
              uVar39 = uStack_6ac;
              uVar40 = uStack_6ab;
              uVar41 = uStack_6aa;
              uVar42 = uStack_6a9;
              rhs = local_780;
              if (bVar8) goto LAB_003ad519;
            }
            if ((pgVar20->m[lVar23 + 0xf].n &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[uVar17]) == 0) break;
            uVar19 = uVar18 + 1;
            uVar21 = uVar21 + uVar18 + 1 & local_4b0._16_8_;
          } while (uVar19 <= (ulong)local_4b0._16_8_);
          local_780 = (SVInt *)0x0;
          rhs = local_780;
LAB_003ad519:
          local_780 = rhs;
          if (local_780 == (SVInt *)0x0) {
            if (local_480 < local_488) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
              ::nosize_unchecked_emplace_at<slang::SVInt&>
                        ((locator *)&local_588,
                         (table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
                          *)local_4b0,(arrays_type *)(local_4b0 + 8),pos0,hash,pvVar13);
              local_480 = local_480 + 1;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
              ::unchecked_emplace_with_rehash<slang::SVInt&>
                        ((locator *)&local_588,
                         (table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
                          *)local_4b0,hash,pvVar13);
            }
            Expression::eval((ConstantValue *)&local_588,local_740,(EvalContext *)local_388);
            _Var6 = local_588._M_index;
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage(&local_588);
            __v = local_758;
            if (_Var6 == '\0') goto LAB_003ad4fd;
            pvVar13 = std::
                      get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                (local_758);
            bVar8 = true;
            __v = local_758;
            if ((pvVar13->super_SVIntStorage).unknownFlag == true) {
              SVar43 = parsing::Token::range(&local_778);
              code.subsystem = Declarations;
              code.code = 0x3e;
              goto LAB_003ad57c;
            }
          }
          else {
            SVar43 = parsing::Token::range(&local_778);
            code.subsystem = Declarations;
            code.code = 0x3d;
LAB_003ad57c:
            pDVar14 = ASTContext::addDiag((ASTContext *)local_628,code,SVar43);
            Diagnostic::operator<<(pDVar14,(ConstantValue *)local_758);
            bVar8 = false;
            __v = local_758;
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_730);
      } while (bVar8);
      if (local_448[0].len == 0) {
        Expression::eval((ConstantValue *)&local_3b0,local_740,(EvalContext *)local_388);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_3b0);
      }
      EvalContext::reportAllDiags((EvalContext *)local_388);
      src = extraout_RDX;
      if ((this_00->valid == true) &&
         (bVar8 = Scope::isUninstantiated(*(Scope **)this_01), src = extraout_RDX_00,
         local_448[0].len != 0)) {
        lVar22 = local_448[0].len << 4;
        other = &(local_448[0].data_)->super_SVIntStorage;
        do {
          SVInt::SVInt((SVInt *)&local_470,other);
          local_470._M_index = '\x01';
          fromSyntax::anon_class_48_6_985204b5::operator()
                    (&local_670,(ConstantValue *)&local_470,bVar8);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage(&local_470);
          other = other + 1;
          lVar22 = lVar22 + -0x10;
          src = extraout_RDX_01;
        } while (lVar22 != 0);
      }
      iVar9 = SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::copy
                        (&local_5f0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>,
                         (EVP_PKEY_CTX *)local_748,src);
      ppGVar5 = local_5f0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_;
      (this_00->entries)._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar9);
      (this_00->entries)._M_extent._M_extent_value = extraout_RDX_02;
      if (local_5f0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len == 0) {
        local_730._0_8_ = (void *)0x0;
        local_730._8_4_ = 0x20;
        local_730._12_2_ = 1;
        SVInt::clearUnusedBits((SVInt *)&local_730);
        local_698._0_8_ = local_730._0_8_;
        local_698._8_4_ = local_730._8_4_;
        local_698._12_1_ = local_730._12_1_;
        local_698._13_1_ = local_730._13_1_;
        if (0x40 < (uint)local_730._8_4_ || (local_730._12_2_ & 0x100) != 0) {
          local_730._0_8_ = (void *)0x0;
        }
        member = &local_698;
        local_678 = 1;
        fromSyntax::anon_class_48_6_985204b5::operator()(&local_670,(ConstantValue *)member,true);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_698);
        if (((0x40 < (uint)local_730._8_4_) || ((local_730._12_2_ & 0x100) != 0)) &&
           ((void *)local_730._0_8_ != (void *)0x0)) {
          operator_delete__((void *)local_730._0_8_);
        }
      }
      else {
        lVar22 = local_5f0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len << 3;
        lVar23 = 0;
        do {
          member = *(_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     **)((long)ppGVar5 + lVar23);
          Scope::insertMember(&this_00->super_Scope,(Symbol *)member,
                              (this_00->super_Scope).lastMember,false,true);
          lVar23 = lVar23 + 8;
        } while (lVar22 != lVar23);
      }
LAB_003ad90a:
      SmallVectorBase<slang::SVInt>::cleanup(local_448,(EVP_PKEY_CTX *)member);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                     *)local_4b0);
      SmallVectorBase<slang::Diagnostic>::cleanup(&local_148,(EVP_PKEY_CTX *)member);
      SmallVectorBase<slang::Diagnostic>::cleanup(&local_240,(EVP_PKEY_CTX *)member);
      if (local_280 != local_268) {
        operator_delete(local_280);
      }
      SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup(&local_338,(EVP_PKEY_CTX *)member);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_5b0);
  if (local_5f0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_ !=
      (pointer)local_5f0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.firstElement
     ) {
    operator_delete(local_5f0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_);
  }
  return this_00;
}

Assistant:

GenerateBlockArraySymbol& GenerateBlockArraySymbol::fromSyntax(Compilation& comp,
                                                               const LoopGenerateSyntax& syntax,
                                                               SymbolIndex scopeIndex,
                                                               const ASTContext& context,
                                                               uint32_t constructIndex) {
    auto [name, loc] = getGenerateBlockName(*syntax.block);
    auto result = comp.emplace<GenerateBlockArraySymbol>(comp, name, loc, constructIndex);
    result->setSyntax(syntax);
    result->setAttributes(*context.scope, syntax.attributes);

    auto genvar = syntax.identifier;
    if (genvar.isMissing())
        return *result;

    auto genvarSyntax = comp.emplace<IdentifierNameSyntax>(genvar);

    // Walk up the tree a bit to see if we're nested inside another generate loop.
    // If we are, we'll include that parent's array size in our decision about
    // wether we've looped too many times within one generate block.
    const uint64_t baseCount = getGenerateLoopCount(*context.scope);
    const uint64_t loopLimit = comp.getOptions().maxGenerateSteps;

    // If the loop initializer has a `genvar` keyword, we can use the name directly
    // Otherwise we need to do a lookup to make sure we have the actual genvar somewhere.
    if (!syntax.genvar) {
        auto symbol = Lookup::unqualifiedAt(*context.scope, genvar.valueText(),
                                            context.getLocation(), genvar.range());
        if (!symbol)
            return *result;

        if (symbol->kind != SymbolKind::Genvar) {
            auto& diag = context.addDiag(diag::NotAGenvar, genvar.range());
            diag << genvar.valueText();
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return *result;
        }

        comp.noteReference(*symbol);
    }
    else {
        // Fabricate a genvar symbol to live in this array since it was declared inline.
        auto genvarSymbol = comp.emplace<GenvarSymbol>(genvar.valueText(), genvar.location());
        genvarSymbol->setSyntax(*genvarSyntax);
        result->addMember(*genvarSymbol);
    }

    SmallVector<const GenerateBlockSymbol*> entries;
    auto createBlock = [&, blockLoc = loc](ConstantValue value, bool isUninstantiated) {
        // Spec: each generate block gets their own scope, with an implicit
        // localparam of the same name as the genvar.
        auto block = comp.emplace<GenerateBlockSymbol>(comp, "", blockLoc, (uint32_t)entries.size(),
                                                       isUninstantiated);
        auto implicitParam = comp.emplace<ParameterSymbol>(genvar.valueText(), genvar.location(),
                                                           true /* isLocal */, false /* isPort */);
        implicitParam->setSyntax(*genvarSyntax);
        comp.noteReference(*implicitParam);

        block->addMember(*implicitParam);
        block->setSyntax(*syntax.block);

        addBlockMembers(*block, *syntax.block);

        implicitParam->setType(comp.getIntegerType());
        implicitParam->setValue(comp, std::move(value), /* needsCoercion */ false);
        implicitParam->setIsFromGenvar(true);

        block->arrayIndex = &implicitParam->getValue().integer();
        entries.push_back(block);
    };

    // Bind the initialization expression.
    auto& initial = Expression::bindRValue(comp.getIntegerType(), *syntax.initialExpr,
                                           syntax.equals.range(), context);
    ConstantValue initialVal = context.eval(initial);
    if (!initialVal)
        return *result;

    // Fabricate a local variable that will serve as the loop iteration variable.
    auto& iterScope = *comp.emplace<StatementBlockSymbol>(comp, "", loc,
                                                          StatementBlockKind::Sequential,
                                                          VariableLifetime::Automatic);
    auto& local = *comp.emplace<VariableSymbol>(genvar.valueText(), genvar.location(),
                                                VariableLifetime::Automatic);
    local.setType(comp.getIntegerType());
    local.flags |= VariableFlags::CompilerGenerated;

    iterScope.setTemporaryParent(*context.scope, scopeIndex);
    iterScope.addMember(local);

    // Bind the stop and iteration expressions so we can reuse them on each iteration.
    ASTContext iterContext(iterScope, LookupLocation::max);
    auto& stopExpr = Expression::bind(*syntax.stopExpr, iterContext);
    auto& iterExpr = Expression::bind(*syntax.iterationExpr, iterContext,
                                      ASTFlags::AssignmentAllowed);
    if (stopExpr.bad() || iterExpr.bad())
        return *result;

    if (!context.requireBooleanConvertible(stopExpr))
        return *result;

    // Create storage for the iteration variable.
    EvalContext evalContext(iterContext);
    evalContext.pushEmptyFrame();

    auto loopVal = evalContext.createLocal(&local, initialVal);
    if (loopVal->integer().hasUnknown())
        iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;

    // Generate blocks! In the first pass we evaluate all indices for correctness,
    // letting us enforce the loop limit to detect infinite loops before trying
    // to generate more hierarchy.
    uint64_t loopCount = 0;
    SmallSet<SVInt, 8> usedValues;
    SmallVector<SVInt, 8> indices;
    while (true) {
        loopCount += baseCount;
        if (loopCount > loopLimit) {
            context.addDiag(diag::MaxGenerateStepsExceeded, syntax.keyword.range());
            return *result;
        }

        auto stop = stopExpr.eval(evalContext);
        if (stop.bad() || !stop.isTrue()) {
            result->valid = !stop.bad();
            break;
        }

        indices.emplace_back(loopVal->integer());
        auto pair = usedValues.emplace(loopVal->integer());
        if (!pair.second) {
            iterContext.addDiag(diag::GenvarDuplicate, genvar.range()) << *loopVal;
            break;
        }

        if (!iterExpr.eval(evalContext))
            break;

        if (loopVal->integer().hasUnknown()) {
            iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;
            break;
        }
    }

    // If we never ran the iteration expression, run it once to ensure
    // we've collected all errors.
    if (indices.empty())
        iterExpr.eval(evalContext);

    evalContext.reportAllDiags();

    // If the generate loop completed successfully, go through and create blocks.
    if (result->valid) {
        bool isUninstantiated = context.scope->isUninstantiated();
        for (auto& index : indices)
            createBlock(index, isUninstantiated);
    }

    result->entries = entries.copy(comp);
    if (entries.empty()) {
        createBlock(SVInt(32, 0, true), true);
    }
    else {
        for (auto entry : entries)
            result->addMember(*entry);
    }

    return *result;
}